

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

int parse_spec(pmtr_t *cfg,UT_string *em,char *spec,in_addr_t *addr,int *port,char **iface)

{
  int iVar1;
  char *__name;
  char *pcVar2;
  char *pcVar3;
  hostent *phVar4;
  size_t sVar5;
  int *piVar6;
  int local_70;
  int rc;
  int hlen;
  hostent *h;
  char *at;
  char *host;
  char *colon;
  char *proto;
  char **iface_local;
  int *port_local;
  in_addr_t *addr_local;
  char *spec_local;
  UT_string *em_local;
  pmtr_t *cfg_local;
  
  local_70 = -1;
  if (iface != (char **)0x0) {
    *iface = (char *)0x0;
  }
  iVar1 = strncmp(spec,"udp://",6);
  if (iVar1 == 0) {
    __name = spec + 6;
    pcVar2 = strrchr(spec,0x3a);
    if (pcVar2 != (char *)0x0) {
      iVar1 = atoi(pcVar2 + 1);
      *port = iVar1;
      if ((-1 < *port) && (*port < 0x10000)) {
        pcVar3 = strrchr(spec,0x40);
        if ((pcVar3 != (char *)0x0) && (iface != (char **)0x0)) {
          *iface = pcVar3 + 1;
        }
        if (cfg->test_only != 0) {
          return 0;
        }
        *pcVar2 = '\0';
        phVar4 = gethostbyname(__name);
        sVar5 = strlen(__name);
        *pcVar2 = ':';
        if (phVar4 == (hostent *)0x0) {
          piVar6 = __h_errno_location();
          pcVar2 = hstrerror(*piVar6);
          utstring_printf(em,"lookup [%.*s]: %s",sVar5 & 0xffffffff,__name,pcVar2);
          local_70 = -2;
        }
        else {
          *addr = *(in_addr_t *)*phVar4->h_addr_list;
          local_70 = 0;
        }
      }
    }
  }
  if (local_70 == -1) {
    utstring_printf(em,"required format: udp://1.2.3.4:5678[@eth2]");
  }
  return local_70;
}

Assistant:

static int parse_spec(pmtr_t *cfg, UT_string *em, char *spec, 
                      in_addr_t *addr, int *port, char **iface) {
  char *proto = spec, *colon, *host, *at;
  struct hostent *h;
  int hlen, rc=-1;
  if (iface) *iface = NULL;

  if (strncmp(proto, "udp://", 6)) goto done;
  host = &spec[6];

  if ( !(colon = strrchr(spec, ':'))) goto done;
  *port = atoi(colon+1);
  if ((*port < 0) || (*port > 65535)) goto done;

  if ( (at = strrchr(spec, '@')) != NULL) { // trailing @eth2
    if (iface) *iface = at+1;
  }

  /* stop here if syntax checking */
  if (cfg->test_only) return 0; 

  /* dns lookup. */
  *colon = '\0'; 
  h = gethostbyname(host); 
  hlen = strlen(host);
  *colon = ':';
  if (!h) {
    utstring_printf(em, "lookup [%.*s]: %s", hlen, host, hstrerror(h_errno));
    rc = -2;
    goto done;
  }

  *addr = ((struct in_addr*)h->h_addr)->s_addr;
  rc = 0; /* success */

 done:
  if (rc == -1) utstring_printf(em,"required format: udp://1.2.3.4:5678[@eth2]");
  return rc;
}